

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopGroup.cpp
# Opt level: O2

shared_ptr<Liby::UdpSocket> __thiscall
Liby::EventLoopGroup::creatUdpServer(EventLoopGroup *this,string *host,string *service)

{
  Logger *this_00;
  string *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _List_node_base *__args_1;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  shared_ptr<Liby::Socket> sVar1;
  shared_ptr<Liby::UdpSocket> sVar2;
  SockPtr sockPtr;
  list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_> eps;
  
  Resolver::resolve(&eps,service,in_RCX);
  if (eps.super__List_base<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>._M_impl._M_node.
      super__List_node_base._M_next == (_List_node_base *)&eps) {
    this_00 = Logger::getLogger();
    Logger::log(this_00,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    *(undefined8 *)this = 0;
    *(undefined8 *)&(this->bf_).super__Function_base._M_functor = 0;
  }
  else {
    __args_1 = eps.super__List_base<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>._M_impl._M_node
               .super__List_node_base._M_next + 1;
    sVar1 = std::make_shared<Liby::Socket,Liby::Endpoint&,bool>
                      ((Endpoint *)&sockPtr,(bool *)__args_1);
    Socket::listen(sockPtr.super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   (int)__args_1,
                   (int)sVar1.super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi);
    std::make_shared<Liby::UdpSocket,Liby::EventLoop*&,std::shared_ptr<Liby::Socket>&>
              ((EventLoop **)this,(shared_ptr<Liby::Socket> *)host[3]._M_dataplus._M_p);
    UdpSocket::start(*(UdpSocket **)this);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&sockPtr.super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  std::__cxx11::_List_base<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>::_M_clear
            (&eps.super__List_base<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>);
  sVar2.super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Liby::UdpSocket>)
         sVar2.super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<UdpSocket>
EventLoopGroup::creatUdpServer(const std::string &host,
                               const std::string &service) {
    auto eps = Resolver::resolve(host, service);
    if (eps.empty()) {
        error("host or service unavaiable");
        return nullptr;
    }

    SockPtr sockPtr = std::make_shared<Socket>(eps.front(), true);
    sockPtr->listen();

    std::shared_ptr<UdpSocket> udpSocket =
        std::make_shared<UdpSocket>(ploops_[0], sockPtr);
    udpSocket->start();

    return udpSocket;
}